

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

Vec4<double> * __thiscall
Imath_2_5::Box<Imath_2_5::Vec4<double>_>::center
          (Vec4<double> *__return_storage_ptr__,Box<Imath_2_5::Vec4<double>_> *this)

{
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  Vec4<double>::operator+(&this->max,&this->min);
  __return_storage_ptr__->x = local_38 * 0.5;
  __return_storage_ptr__->y = dStack_30 * 0.5;
  __return_storage_ptr__->z = local_28 * 0.5;
  __return_storage_ptr__->w = dStack_20 * 0.5;
  return __return_storage_ptr__;
}

Assistant:

inline T
Box<T>::center() const 
{ 
    return (max + min) / 2;
}